

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::DomeLight::TextureFormat>_>::
authored(TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::DomeLight::TextureFormat>_> *this
        )

{
  if (((this->_empty == false) && ((this->_attrib).has_value_ == false)) &&
     ((this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    return this->_blocked;
  }
  return true;
}

Assistant:

bool authored() const {
    if (_empty) {  // authored with empty value.
      return true;
    }
    if (_attrib) {
      return true;
    }
    if (_paths.size()) {
      return true;
    }
    if (_blocked) {
      return true;
    }
    return false;
  }